

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_loadk64(ASMState *as,Reg r,IRIns *ir)

{
  MCode *pMVar1;
  IRIns *pIVar2;
  MCode *pMVar3;
  uint rr;
  x86Op xVar4;
  
  xVar4 = XO_MOVSD;
  rr = r;
  if ((0xffff0000U >> (r & 0x1f) & 1) == 0) {
    xVar4 = XO_MOV;
    rr = r | 0x80200;
  }
  if (ir[1] != (IRIns)0x0) {
    pIVar2 = ir + 1;
    if ((((IRIns *)(long)(int)pIVar2 != pIVar2) &&
        ((ulong)((long)pIVar2 + (0x7ffff358 - (long)as->J)) >> 0x20 != 0)) &&
       (((ulong)((long)pIVar2 + (0x80000000 - (long)as->mcp)) >> 0x20 != 0 ||
        ((ulong)((long)pIVar2 + (0x80000000 - (long)as->mctop)) >> 0x20 != 0)))) {
      if ((ir->field_1).op12 == 0) {
        if ((as->curins <= as->stopins) && ((0xbfefU >> (r & 0x1f) & 1) != 0)) {
          emit_loadu64(as,r,(uint64_t)ir[1]);
          return;
        }
        while (pIVar2 = (IRIns *)as->mcbot, ((ulong)pIVar2 & 7) != 0) {
          as->mcbot = (MCode *)((long)&(pIVar2->field_0).op1 + 1);
          *(undefined1 *)pIVar2 = 0xcc;
        }
        *pIVar2 = ir[1];
        (ir->field_1).op12 = *(int *)&as->mctop - (int)pIVar2;
        pMVar3 = as->mcbot;
        pMVar1 = pMVar3 + 8;
        as->mcbot = pMVar1;
        as->mclim = pMVar3 + 0x48;
        as->J->mcbot = pMVar1;
      }
      emit_rmro(as,xVar4,rr,0x25,(*(int *)&as->mctop - (ir->field_1).op12) - *(int *)&as->mcp);
      return;
    }
    emit_rma(as,xVar4,rr,pIVar2);
    return;
  }
  xVar4 = XO_XORPS;
  if ((0xffff0000U >> ((byte)r & 0x1f) & 1) == 0) {
    xVar4 = 0x330000fe;
  }
  emit_rr(as,xVar4,r,r);
  return;
}

Assistant:

static void emit_loadk64(ASMState *as, Reg r, IRIns *ir)
{
  Reg r64;
  x86Op xo;
  const uint64_t *k = &ir_k64(ir)->u64;
  if (rset_test(RSET_FPR, r)) {
    r64 = r;
    xo = XO_MOVSD;
  } else {
    r64 = r | REX_64;
    xo = XO_MOV;
  }
  if (*k == 0) {
    emit_rr(as, rset_test(RSET_FPR, r) ? XO_XORPS : XO_ARITH(XOg_XOR), r, r);
#if LJ_GC64
  } else if (checki32((intptr_t)k) || checki32(dispofs(as, k)) ||
	     (checki32(mcpofs(as, k)) && checki32(mctopofs(as, k)))) {
    emit_rma(as, xo, r64, k);
  } else {
    if (ir->i) {
      lj_assertA(*k == *(uint64_t*)(as->mctop - ir->i),
		 "bad interned 64 bit constant");
    } else if (as->curins <= as->stopins && rset_test(RSET_GPR, r)) {
      emit_loadu64(as, r, *k);
      return;
    } else {
      /* If all else fails, add the FP constant at the MCode area bottom. */
      while ((uintptr_t)as->mcbot & 7) *as->mcbot++ = XI_INT3;
      *(uint64_t *)as->mcbot = *k;
      ir->i = (int32_t)(as->mctop - as->mcbot);
      as->mcbot += 8;
      as->mclim = as->mcbot + MCLIM_REDZONE;
      lj_mcode_commitbot(as->J, as->mcbot);
    }
    emit_rmro(as, xo, r64, RID_RIP, (int32_t)mcpofs(as, as->mctop - ir->i));
#else
  } else {
    emit_rma(as, xo, r64, k);
#endif
  }